

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O0

int __thiscall
OB::Parg::parse_args
          (Parg *this,int _argc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_argv)

{
  bool bVar1;
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  undefined1 *puVar6;
  const_reference pvVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  long lVar10;
  byte local_4f9;
  byte local_3d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  _Self local_2c0;
  _Self local_2b8;
  string local_2b0 [32];
  string local_290 [32];
  long local_270;
  size_type delim;
  string a;
  string c_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  _Self local_1a8;
  _Self local_1a0;
  allocator<char> local_192;
  undefined1 local_191;
  undefined1 *local_190;
  undefined8 local_188;
  undefined1 local_180 [8];
  string s;
  size_t j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118 [32];
  string local_f8 [36];
  int local_d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _Self local_90;
  _Self local_88 [3];
  allocator<char> local_6a;
  undefined1 local_69;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  string c;
  string *tmp;
  int i;
  bool dashdash;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *_argv_local;
  int _argc_local;
  Parg *this_local;
  
  if (_argc < 1) {
    this_local._4_4_ = 1;
  }
  else {
    bVar1 = false;
    for (tmp._0_4_ = 0; (int)tmp < _argc; tmp._0_4_ = (int)tmp + 1) {
      c.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(_argv,(long)(int)tmp);
      if (bVar1) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->positional_vec_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   c.field_2._8_8_);
      }
      else {
        uVar4 = std::__cxx11::string::size();
        if (((uVar4 < 2) ||
            (pcVar5 = (char *)std::__cxx11::string::at(c.field_2._8_8_), *pcVar5 != '-')) ||
           (pcVar5 = (char *)std::__cxx11::string::at(c.field_2._8_8_), *pcVar5 == '-')) {
          uVar4 = std::__cxx11::string::size();
          if (((uVar4 < 3) ||
              (pcVar5 = (char *)std::__cxx11::string::at(c.field_2._8_8_), *pcVar5 != '-')) ||
             (pcVar5 = (char *)std::__cxx11::string::at(c.field_2._8_8_), uVar2 = c.field_2._8_8_,
             *pcVar5 != '-')) {
            lVar10 = std::__cxx11::string::size();
            if ((lVar10 == 0) || ((this->is_positional_ & 1U) == 0)) {
              std::operator+(&local_3c0,"no match for \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             c.field_2._8_8_);
              std::operator+(&local_3a0,&local_3c0,"\'");
              std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_3a0);
              std::__cxx11::string::~string((string *)&local_3a0);
              std::__cxx11::string::~string((string *)&local_3c0);
              find_similar(this,(string *)c.field_2._8_8_);
              return -1;
            }
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)c.field_2._8_8_,"--");
            if (bVar3) {
              bVar1 = true;
            }
            else {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string_const&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &this->positional_vec_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         c.field_2._8_8_);
            }
            goto LAB_0011976a;
          }
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)((long)&a.field_2 + 8),uVar2);
          std::__cxx11::string::string((string *)&delim);
          local_270 = std::__cxx11::string::find(a.field_2._M_local_buf + 8,0x14f21d);
          if (local_270 != -1) {
            std::__cxx11::string::substr((ulong)local_290,c.field_2._8_8_);
            std::__cxx11::string::operator=((string *)(a.field_2._M_local_buf + 8),local_290);
            std::__cxx11::string::~string(local_290);
            uVar2 = c.field_2._8_8_;
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_2b0,uVar2);
            std::__cxx11::string::operator=((string *)&delim,local_2b0);
            std::__cxx11::string::~string(local_2b0);
          }
          local_2b8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::find(&this->data_,(key_type *)((long)&a.field_2 + 8));
          local_2c0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::end(&this->data_);
          bVar3 = std::operator!=(&local_2b8,&local_2c0);
          if (bVar3) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                     ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
            if ((pmVar9->seen_ & 1U) == 0) {
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
              if (((pmVar9->mode_ & 1U) == 0) ||
                 (lVar10 = std::__cxx11::string::size(), lVar10 != 0)) {
                lVar10 = std::__cxx11::string::size();
                if (lVar10 == 0) {
                  if (_argc <= (int)tmp + 1) {
                    std::operator+(&local_340,"option \'--",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&a.field_2 + 8));
                    std::operator+(&local_320,&local_340,"\' requires an arg");
                    std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_320);
                    std::__cxx11::string::~string((string *)&local_320);
                    std::__cxx11::string::~string((string *)&local_340);
                    this_local._4_4_ = -1;
                    local_d4 = 1;
                    goto LAB_00119623;
                  }
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::at(_argv,(long)((int)tmp + 1));
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
                  std::__cxx11::string::operator=((string *)&pmVar9->value_,(string *)pvVar7);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
                  pmVar9->seen_ = true;
                  tmp._0_4_ = (int)tmp + 1;
                }
                else {
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
                  std::__cxx11::string::operator=((string *)&pmVar9->value_,(string *)&delim);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
                  pmVar9->seen_ = true;
                }
              }
              else {
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
                std::__cxx11::string::operator=((string *)&pmVar9->value_,"1");
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
                pmVar9->seen_ = true;
              }
              local_d4 = 0;
            }
            else {
              std::operator+(&local_300,"option \'--",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&a.field_2 + 8));
              std::operator+(&local_2e0,&local_300,"\' has already been seen");
              std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_2e0);
              std::__cxx11::string::~string((string *)&local_2e0);
              std::__cxx11::string::~string((string *)&local_300);
              this_local._4_4_ = -1;
              local_d4 = 1;
            }
          }
          else {
            std::operator+(&local_380,"invalid option \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           c.field_2._8_8_);
            std::operator+(&local_360,&local_380,"\'");
            std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_360);
            std::__cxx11::string::~string((string *)&local_360);
            std::__cxx11::string::~string((string *)&local_380);
            find_similar(this,(string *)((long)&a.field_2 + 8));
            this_local._4_4_ = -1;
            local_d4 = 1;
          }
LAB_00119623:
          std::__cxx11::string::~string((string *)&delim);
          std::__cxx11::string::~string((string *)(a.field_2._M_local_buf + 8));
        }
        else {
          puVar6 = (undefined1 *)std::__cxx11::string::at(c.field_2._8_8_);
          local_69 = *puVar6;
          local_68 = &local_69;
          local_60 = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_58,local_68,local_60,&local_6a);
          std::allocator<char>::~allocator(&local_6a);
          local_88[0]._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&this->flags_,(key_type *)local_58);
          local_90._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(&this->flags_);
          bVar3 = std::operator!=(local_88,&local_90);
          local_3d9 = 0;
          if (bVar3) {
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(&this->flags_,(key_type *)local_58);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                     ::at(&this->data_,pmVar8);
            local_3d9 = pmVar9->mode_ ^ 0xff;
          }
          if ((local_3d9 & 1) == 0) {
            for (s.field_2._8_8_ = 1; uVar2 = s.field_2._8_8_, uVar4 = std::__cxx11::string::size(),
                (ulong)uVar2 < uVar4; s.field_2._8_8_ = s.field_2._8_8_ + 1) {
              puVar6 = (undefined1 *)std::__cxx11::string::at(c.field_2._8_8_);
              local_191 = *puVar6;
              local_190 = &local_191;
              local_188 = 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)local_180,local_190,local_188,&local_192);
              std::allocator<char>::~allocator(&local_192);
              local_1a0._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&this->flags_,(key_type *)local_180);
              local_1a8._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end(&this->flags_);
              bVar3 = std::operator!=(&local_1a0,&local_1a8);
              local_4f9 = 0;
              if (bVar3) {
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(&this->flags_,(key_type *)local_180);
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(&this->data_,pmVar8);
                local_4f9 = pmVar9->mode_;
              }
              if ((local_4f9 & 1) == 0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&c_1.field_2 + 8),"invalid flag \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               c.field_2._8_8_);
                std::operator+(&local_208,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&c_1.field_2 + 8),"\'");
                std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_208);
                std::__cxx11::string::~string((string *)&local_208);
                std::__cxx11::string::~string((string *)(c_1.field_2._M_local_buf + 8));
                this_local._4_4_ = -1;
                local_d4 = 1;
              }
              else {
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(&this->flags_,(key_type *)local_180);
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(&this->data_,pmVar8);
                if ((pmVar9->seen_ & 1U) == 0) {
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&this->flags_,(key_type *)local_180);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(&this->data_,pmVar8);
                  std::__cxx11::string::operator=((string *)&pmVar9->value_,"1");
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&this->flags_,(key_type *)local_180);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(&this->data_,pmVar8);
                  pmVar9->seen_ = true;
                  local_d4 = 0;
                }
                else {
                  std::operator+(&local_1e8,"flag \'-",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_180);
                  std::operator+(&local_1c8,&local_1e8,"\' has already been seen");
                  std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_1c8);
                  std::__cxx11::string::~string((string *)&local_1c8);
                  std::__cxx11::string::~string((string *)&local_1e8);
                  this_local._4_4_ = -1;
                  local_d4 = 1;
                }
              }
              std::__cxx11::string::~string((string *)local_180);
              if (local_d4 != 0) goto LAB_0011901c;
            }
LAB_00119012:
            local_d4 = 0;
          }
          else {
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(&this->flags_,(key_type *)local_58);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                     ::at(&this->data_,pmVar8);
            if ((pmVar9->seen_ & 1U) == 0) {
              uVar4 = std::__cxx11::string::size();
              if ((uVar4 < 3) ||
                 (pcVar5 = (char *)std::__cxx11::string::at(c.field_2._8_8_),
                 uVar2 = c.field_2._8_8_, *pcVar5 == '=')) {
                uVar4 = std::__cxx11::string::size();
                if ((uVar4 < 4) ||
                   (pcVar5 = (char *)std::__cxx11::string::at(c.field_2._8_8_),
                   uVar2 = c.field_2._8_8_, *pcVar5 != '=')) {
                  if (_argc <= (int)tmp + 1) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&j,"flag \'-",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_58);
                    std::operator+(&local_138,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&j,"\' requires an arg");
                    std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_138);
                    std::__cxx11::string::~string((string *)&local_138);
                    std::__cxx11::string::~string((string *)&j);
                    this_local._4_4_ = -1;
                    local_d4 = 1;
                    goto LAB_0011901c;
                  }
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::at(_argv,(long)((int)tmp + 1));
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&this->flags_,(key_type *)local_58);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(&this->data_,pmVar8);
                  std::__cxx11::string::operator=((string *)&pmVar9->value_,(string *)pvVar7);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&this->flags_,(key_type *)local_58);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(&this->data_,pmVar8);
                  pmVar9->seen_ = true;
                  tmp._0_4_ = (int)tmp + 1;
                }
                else {
                  std::__cxx11::string::size();
                  std::__cxx11::string::substr((ulong)local_118,uVar2);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&this->flags_,(key_type *)local_58);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(&this->data_,pmVar8);
                  std::__cxx11::string::operator=((string *)&pmVar9->value_,local_118);
                  std::__cxx11::string::~string(local_118);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&this->flags_,(key_type *)local_58);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(&this->data_,pmVar8);
                  pmVar9->seen_ = true;
                }
              }
              else {
                std::__cxx11::string::size();
                std::__cxx11::string::substr((ulong)local_f8,uVar2);
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(&this->flags_,(key_type *)local_58);
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(&this->data_,pmVar8);
                std::__cxx11::string::operator=((string *)&pmVar9->value_,local_f8);
                std::__cxx11::string::~string(local_f8);
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(&this->flags_,(key_type *)local_58);
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(&this->data_,pmVar8);
                pmVar9->seen_ = true;
              }
              goto LAB_00119012;
            }
            std::operator+(&local_d0,"flag \'-",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_58);
            std::operator+(&local_b0,&local_d0,"\' has already been seen");
            std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_d0);
            this_local._4_4_ = -1;
            local_d4 = 1;
          }
LAB_0011901c:
          std::__cxx11::string::~string((string *)local_58);
        }
        if (local_d4 != 0) {
          return this_local._4_4_;
        }
      }
LAB_0011976a:
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int parse_args(int _argc, std::vector<std::string> const& _argv)
  {
    if (_argc < 1) return 1;

    bool dashdash {false};

    // loop through arg vector
    for (int i = 0; i < _argc; ++i)
    {
      std::string const& tmp {_argv.at(static_cast<std::size_t>(i))};
      // std::cerr << "ARG: " << i << " -> " << tmp << std::endl;

      if (dashdash)
      {
        positional_vec_.emplace_back(tmp);
        continue;
      }

      if (tmp.size() > 1 && tmp.at(0) == '-' && tmp.at(1) != '-')
      {
        // short
        // std::cerr << "SHORT: " << tmp << std::endl;

        std::string c {tmp.at(1)};
        if (flags_.find(c) != flags_.end() && !(data_.at(flags_.at(c)).mode_))
        {
          // short arg
          // std::cerr << "SHORT: arg -> " << c << std::endl;

          if (data_.at(flags_.at(c)).seen_)
          {
            // error
            error_ = "flag '-" + c + "' has already been seen";
            return -1;
          }

          if (tmp.size() > 2 && tmp.at(2) != '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(2, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (tmp.size() > 3 && tmp.at(2) == '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(3, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (i + 1 < _argc)
          {
            data_.at(flags_.at(c)).value_ = _argv.at(static_cast<std::size_t>(i + 1));
            data_.at(flags_.at(c)).seen_ = true;
            ++i;
          }
          else
          {
            // error
            error_ = "flag '-" + c + "' requires an arg";
            return -1;
          }
        }
        else
        {
          // short mode
          for (std::size_t j = 1; j < tmp.size(); ++j)
          {
            std::string s {tmp.at(j)};

            if (flags_.find(s) != flags_.end() && data_.at(flags_.at(s)).mode_)
            {
              // std::cerr << "SHORT: mode -> " << s << std::endl;

              if (data_.at(flags_.at(s)).seen_)
              {
                // error
                error_ = "flag '-" + s + "' has already been seen";
                return -1;
              }

              data_.at(flags_.at(s)).value_ = "1";
              data_.at(flags_.at(s)).seen_ = true;
            }
            else
            {
              // error
              error_ = "invalid flag '" + tmp + "'";
              // find_similar(s);

              return -1;
            }
          }
        }
      }
      else if (tmp.size() > 2 && tmp.at(0) == '-' && tmp.at(1) == '-')
      {
        // long || --
        // std::cerr << "LONG: " << tmp << std::endl;
        std::string c {tmp.substr(2, tmp.size() - 1)};
        std::string a;

        auto const delim = c.find("=");
        if (delim != std::string::npos)
        {
          c = tmp.substr(2, delim);
          a = tmp.substr(3 + delim, tmp.size() - 1);
        }

        if (data_.find(c) != data_.end())
        {
          if (data_.at(c).seen_)
          {
            // error
            error_ = "option '--" + c + "' has already been seen";
            return -1;
          }

          if (data_.at(c).mode_ && a.size() == 0)
          {
            // std::cerr << "LONG: mode -> " << c << std::endl;
            data_.at(c).value_ = "1";
            data_.at(c).seen_ = true;
          }
          else
          {
            // std::cerr << "LONG: arg -> " << c << std::endl;
            if (a.size() > 0)
            {
              data_.at(c).value_ = a;
              data_.at(c).seen_ = true;
            }
            else if (i + 1 < _argc)
            {
              data_.at(c).value_ = _argv.at(static_cast<std::size_t>(i + 1));
              data_.at(c).seen_ = true;
              ++i;
            }
            else
            {
              // error
              error_ = "option '--" + c + "' requires an arg";
              return -1;
            }
          }
        }
        else
        {
          // error
          error_ = "invalid option '" + tmp + "'";
          find_similar(c);
          return -1;
        }
      }
      else if (tmp.size() > 0 && is_positional_)
      {
        // positional
        // std::cerr << "POS: " << tmp << std::endl;
        if (tmp == "--")
        {
          dashdash = true;
        }
        else
        {
          positional_vec_.emplace_back(tmp);
        }
      }
      else
      {
        // error
        error_ = "no match for '" + tmp + "'";
        find_similar(tmp);
        return -1;
      }
    }

    return 0;
  }